

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

void __thiscall E64::settings_t::write_current_path_to_settings(settings_t *this)

{
  FILE *__stream;
  long in_RDI;
  char *temp_char;
  FILE *temp_file;
  char *local_18;
  
  chdir((char *)(in_RDI + 0x108));
  __stream = fopen("PATH","w");
  for (local_18 = (char *)(in_RDI + 0x308); *local_18 != '\0'; local_18 = local_18 + 1) {
    fwrite(local_18,1,1,__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void E64::settings_t::write_current_path_to_settings()
{
	chdir(settings_path);
	FILE *temp_file = fopen("PATH", "w");

	char *temp_char = current_path;

	while (*temp_char != '\0') {
		fwrite(temp_char, 1, 1, temp_file);
		temp_char++;
	}
	fclose(temp_file);
}